

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int enter_close(quicly_conn_t *conn,int local_is_initiating,int wait_draining)

{
  int iVar1;
  quicly_sent_t *pqVar2;
  int64_t iVar3;
  long lVar4;
  int in_EDX;
  int in_ESI;
  uint64_t in_RDI;
  quicly_conn_t *unaff_retaddr;
  int ret;
  uint16_t in_stack_ffffffffffffffce;
  quicly_sentmap_t *in_stack_ffffffffffffffd0;
  quicly_sentmap_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  if (2 < *(uint *)(in_RDI + 8)) {
    __assert_fail("conn->super.state < QUICLY_STATE_CLOSING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x11d2,"int enter_close(quicly_conn_t *, int, int)");
  }
  iVar1 = discard_sentmap_by_epoch
                    ((quicly_conn_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (uint)(in_RDI >> 0x20));
  if ((iVar1 == 0) &&
     (iVar1 = quicly_sentmap_prepare
                        ((quicly_sentmap_t *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         CONCAT44(in_ESI,in_EDX),'\0'), iVar1 == 0)) {
    pqVar2 = quicly_sentmap_allocate
                       (in_stack_ffffffffffffffd8,(quicly_sent_acked_cb)in_stack_ffffffffffffffd0);
    if (pqVar2 == (quicly_sent_t *)0x0) {
      iVar1 = 0x201;
    }
    else {
      quicly_sentmap_commit(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce);
      *(long *)(in_RDI + 0x658) = *(long *)(in_RDI + 0x658) + 1;
      if (in_ESI == 0) {
        *(undefined4 *)(in_RDI + 8) = 4;
        if (in_EDX == 0) {
          lVar4 = 0;
        }
        else {
          lVar4 = *(long *)(in_RDI + 0x9c0);
          iVar3 = get_sentmap_expiration_time((quicly_conn_t *)0x146437);
          lVar4 = lVar4 + iVar3;
        }
        *(long *)(in_RDI + 0x730) = lVar4;
      }
      else {
        *(undefined4 *)(in_RDI + 8) = 3;
        *(undefined8 *)(in_RDI + 0x730) = 0;
      }
      update_loss_alarm(unaff_retaddr,in_stack_fffffffffffffffc);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int enter_close(quicly_conn_t *conn, int local_is_initiating, int wait_draining)
{
    int ret;

    assert(conn->super.state < QUICLY_STATE_CLOSING);

    /* release all inflight info, register a close timeout */
    if ((ret = discard_sentmap_by_epoch(conn, ~0u)) != 0)
        return ret;
    if ((ret = quicly_sentmap_prepare(&conn->egress.loss.sentmap, conn->egress.packet_number, conn->stash.now,
                                      QUICLY_EPOCH_INITIAL)) != 0)
        return ret;
    if (quicly_sentmap_allocate(&conn->egress.loss.sentmap, on_end_closing) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    quicly_sentmap_commit(&conn->egress.loss.sentmap, 0);
    ++conn->egress.packet_number;

    if (local_is_initiating) {
        conn->super.state = QUICLY_STATE_CLOSING;
        conn->egress.send_ack_at = 0;
    } else {
        conn->super.state = QUICLY_STATE_DRAINING;
        conn->egress.send_ack_at = wait_draining ? conn->stash.now + get_sentmap_expiration_time(conn) : 0;
    }

    update_loss_alarm(conn, 0);

    return 0;
}